

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

SPxLPBase<double> * __thiscall
soplex::SPxLPBase<double>::operator=
          (SPxLPBase<double> *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          *old)

{
  SPxSense SVar1;
  SPxLPBase<double> *in_RSI;
  SPxLPBase<double> *in_RDI;
  double dVar2;
  
  if (in_RDI != in_RSI) {
    LPRowSetBase<double>::operator=
              (&in_RSI->super_LPRowSetBase<double>,
               (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)in_RDI);
    LPColSetBase<double>::operator=
              ((LPColSetBase<double> *)in_RSI,
               (LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)in_RDI);
    SVar1 = MAXIMIZE;
    if (in_RSI->thesense == MINIMIZE) {
      SVar1 = MINIMIZE;
    }
    in_RDI->thesense = SVar1;
    dVar2 = boost::multiprecision::number::operator_cast_to_double
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)0x453b22);
    in_RDI->offset = dVar2;
    in_RDI->_isScaled =
         (bool)(*(byte *)&in_RSI[1].super_LPRowSetBase<double>.super_SVSetBase<double>.
                          super_ClassArray<soplex::Nonzero<double>_>.memFactor & 1);
    std::shared_ptr<soplex::Tolerances>::operator=
              ((shared_ptr<soplex::Tolerances> *)in_RSI,(shared_ptr<soplex::Tolerances> *)in_RDI);
    in_RDI->lp_scaler = (SPxScaler<double> *)0x0;
    in_RDI->spxout =
         (SPxOut *)in_RSI[1].super_LPRowSetBase<double>.super_SVSetBase<double>.set.thekey;
  }
  return in_RDI;
}

Assistant:

SPxLPBase<R>& operator=(const SPxLPBase<S>& old)
   {
      if(this != (const SPxLPBase<R>*)(&old))
      {
         // The value of old.lp_scaler has to be nullptr
         // Refer to issue #161 in soplex gitlab
         assert(old.lp_scaler == nullptr);

         LPRowSetBase<R>::operator=(old);
         LPColSetBase<R>::operator=(old);
         thesense = (old.thesense) == SPxLPBase<S>::MINIMIZE ? SPxLPBase<R>::MINIMIZE :
                    SPxLPBase<R>::MAXIMIZE;
         offset = R(old.offset);
         _isScaled = old._isScaled;
         _tolerances = old._tolerances;

         // this may have un-intended consequences in the future
         lp_scaler = nullptr;
         spxout = old.spxout;

         assert(isConsistent());
      }

      return *this;
   }